

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall Scope::SetIsObject(Scope *this)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  anon_class_8_1_3a281f10 fn;
  undefined4 *puVar4;
  FuncInfo *funcInfo;
  Scope *this_local;
  
  if ((*(ushort *)&this->field_0x44 >> 1 & 1) == 0) {
    *(ushort *)&this->field_0x44 = *(ushort *)&this->field_0x44 & 0xfffd | 2;
    fn.funcInfo = GetFunc(this);
    if ((fn.funcInfo != (FuncInfo *)0x0) &&
       (bVar2 = FuncInfo::HasMaybeEscapedNestedFunc(fn.funcInfo), !bVar2)) {
      ForEachSymbolUntil<Scope::SetIsObject()::__0>(this,fn);
    }
    SVar3 = GetScopeType(this);
    if ((((SVar3 == ScopeType_FunctionBody) ||
         (SVar3 = GetScopeType(this), SVar3 == ScopeType_Parameter)) &&
        (fn.funcInfo != (FuncInfo *)0x0)) &&
       (bVar2 = FuncInfo::IsBodyAndParamScopeMerged(fn.funcInfo), !bVar2)) {
      if ((fn.funcInfo)->paramScope == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                           ,0x4f,"(funcInfo->paramScope)","funcInfo->paramScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      SetIsObject((fn.funcInfo)->paramScope);
      if ((fn.funcInfo)->bodyScope == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                           ,0x52,"(funcInfo->bodyScope)","funcInfo->bodyScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      SetIsObject((fn.funcInfo)->bodyScope);
    }
  }
  return;
}

Assistant:

void Scope::SetIsObject()
{
    if (this->isObject)
    {
        return;
    }

    this->isObject = true;

    // We might set the scope to be object after we have process the symbol
    // (e.g. "With" scope referencing a symbol in an outer scope).
    // If we have func assignment, we need to mark the function to not do stack nested function
    // as these are now assigned to a scope object.
    FuncInfo * funcInfo = this->GetFunc();
    if (funcInfo && !funcInfo->HasMaybeEscapedNestedFunc())
    {
        this->ForEachSymbolUntil([funcInfo](Symbol * const sym)
        {
            if (sym->GetHasFuncAssignment())
            {
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DelayedObjectScopeAssignment")));
                return true;
            }
            return false;
        });
    }

    // If the scope is split (there exists a body and param scope), then it is required that the
    // body and param scope are marked as both requiring either a scope object or a scope slot.
    if ((this->GetScopeType() == ScopeType_FunctionBody || this->GetScopeType() == ScopeType_Parameter)
        && funcInfo && !funcInfo->IsBodyAndParamScopeMerged())
    {
        // The scope is split and one of the scopes (param or body) is being set 
        // as an object, therefore set both the param and body scopes as objects.
        Assert(funcInfo->paramScope);
        funcInfo->paramScope->SetIsObject();

        Assert(funcInfo->bodyScope);
        funcInfo->bodyScope->SetIsObject();
    }
}